

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void skip_multiline_comment(char **input)

{
  char **input_local;
  
  *input = *input + 2;
  while( true ) {
    if (**input == '\0') {
      return;
    }
    if ((**input == '*') && ((*input)[1] == '/')) break;
    *input = *input + 1;
  }
  *input = *input + 2;
  return;
}

Assistant:

static void skip_multiline_comment(char **input)
{
    *input += static_strlen("/*");

    for (; (*input)[0] != '\0'; ++(*input))
    {
        if (((*input)[0] == '*') && ((*input)[1] == '/'))
        {
            *input += static_strlen("*/");
            return;
        }
    }
}